

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZRefPattern.cpp
# Opt level: O2

void __thiscall
TPZRefPattern::CreateMidSideNodes
          (TPZRefPattern *this,TPZGeoEl *gel,int side,TPZVec<long> *newnodeindexes)

{
  TPZAdmChunkVector<TPZGeoNode,_10> *this_00;
  TPZGeoMesh *mesh;
  int iVar1;
  TPZGeoNode *pTVar2;
  TPZGeoEl *pTVar3;
  ostream *poVar4;
  int iX;
  ulong uVar5;
  long nelem;
  int k;
  long lVar6;
  int i;
  ulong uVar7;
  long lVar8;
  REAL RVar9;
  double dVar10;
  double dVar11;
  TPZGeoElSide neighbour;
  TPZManVector<double,_3> newnodecoord_X;
  TPZManVector<double,_3> neighbourcoord_X;
  TPZManVector<double,_3> newnodecoord_xi;
  TPZManVector<double,_3> refnodecoord_X;
  TPZGeoElSide gelside;
  TPZManVector<long,_10> sideindices;
  TPZManVector<int,_10> sideNodes;
  
  mesh = gel->fMesh;
  TPZManVector<int,_10>::TPZManVector(&sideNodes,0);
  SideNodes(this,side,&sideNodes.super_TPZVec<int>);
  gelside.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
  gelside.fGeoEl = gel;
  gelside.fSide = side;
  TPZGeoElSide::Neighbour(&neighbour,&gelside);
  TPZManVector<long,_10>::TPZManVector(&sideindices,0);
  while( true ) {
    if ((neighbour.fGeoEl == (TPZGeoEl *)0x0) ||
       ((neighbour.fGeoEl == gelside.fGeoEl && (neighbour.fSide == gelside.fSide))))
    goto LAB_00f8abe0;
    iVar1 = TPZGeoElSide::HasSubElement(&neighbour);
    if ((iVar1 != 0) &&
       (iVar1 = (**(code **)(*(long *)neighbour.fGeoEl + 0x150))(neighbour.fGeoEl,neighbour.fSide),
       1 < iVar1)) break;
    TPZGeoElSide::Neighbour((TPZGeoElSide *)&refnodecoord_X,&neighbour);
    neighbour.fSide = (int)refnodecoord_X.super_TPZVec<double>.fNElements;
    neighbour.fGeoEl = (TPZGeoEl *)refnodecoord_X.super_TPZVec<double>.fStore;
  }
  (**(code **)(*(long *)neighbour.fGeoEl + 0x120))(neighbour.fGeoEl,neighbour.fSide,&sideindices);
LAB_00f8abe0:
  this_00 = &mesh->fNodeVec;
  lVar8 = 0;
  while( true ) {
    if (sideNodes.super_TPZVec<int>.fNElements <= lVar8) {
      TPZManVector<long,_10>::~TPZManVector(&sideindices);
      TPZManVector<int,_10>::~TPZManVector(&sideNodes);
      return;
    }
    nelem = (long)sideNodes.super_TPZVec<int>.fStore[lVar8];
    neighbourcoord_X.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
    TPZManVector<double,_3>::TPZManVector(&refnodecoord_X,3,(double *)&neighbourcoord_X);
    newnodecoord_xi.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
    TPZManVector<double,_3>::TPZManVector(&neighbourcoord_X,3,(double *)&newnodecoord_xi);
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      pTVar2 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                         (&(this->fRefPatternMesh).fNodeVec.super_TPZChunkVector<TPZGeoNode,_10>,
                          nelem);
      RVar9 = TPZGeoNode::Coord(pTVar2,(int)lVar6);
      refnodecoord_X.super_TPZVec<double>.fStore[lVar6] = RVar9;
    }
    pTVar3 = Element(this,0);
    iVar1 = (**(code **)(*(long *)pTVar3 + 0x210))(pTVar3);
    newnodecoord_X.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
    TPZManVector<double,_3>::TPZManVector(&newnodecoord_xi,(long)iVar1,(double *)&newnodecoord_X);
    lVar6 = 0;
    while( true ) {
      pTVar3 = Element(this,0);
      iVar1 = (**(code **)(*(long *)pTVar3 + 0x210))(pTVar3);
      if (iVar1 <= lVar6) break;
      newnodecoord_xi.super_TPZVec<double>.fStore[lVar6] =
           refnodecoord_X.super_TPZVec<double>.fStore[lVar6];
      lVar6 = lVar6 + 1;
    }
    TPZManVector<double,_3>::TPZManVector(&newnodecoord_X,3);
    (**(code **)(*(long *)gel + 0x228))(gel,&newnodecoord_xi,&newnodecoord_X);
    newnodeindexes->fStore[nelem] = -1;
    dVar10 = -1.0;
    uVar5 = 0xffffffffffffffff;
    for (uVar7 = 0; (long)uVar7 < sideindices.super_TPZVec<long>.fNElements; uVar7 = uVar7 + 1) {
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        pTVar2 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                           (&this_00->super_TPZChunkVector<TPZGeoNode,_10>,
                            sideindices.super_TPZVec<long>.fStore[uVar7]);
        RVar9 = TPZGeoNode::Coord(pTVar2,(int)lVar6);
        neighbourcoord_X.super_TPZVec<double>.fStore[lVar6] = RVar9;
      }
      dVar11 = 0.0;
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        dVar11 = dVar11 + (newnodecoord_X.super_TPZVec<double>.fStore[lVar6] -
                          neighbourcoord_X.super_TPZVec<double>.fStore[lVar6]) *
                          (newnodecoord_X.super_TPZVec<double>.fStore[lVar6] -
                          neighbourcoord_X.super_TPZVec<double>.fStore[lVar6]);
      }
      if (dVar11 < dVar10 || (int)uVar5 < 0) {
        uVar5 = uVar7;
        dVar10 = dVar11;
      }
      uVar5 = uVar5 & 0xffffffff;
    }
    if (sideindices.super_TPZVec<long>.fNElements != 0 && dVar10 < 0.01) {
      newnodeindexes->fStore[nelem] = sideindices.super_TPZVec<long>.fStore[(int)uVar5];
    }
    if ((0.01 <= dVar10) && (sideindices.super_TPZVec<long>.fNElements != 0)) break;
    if (newnodeindexes->fStore[nelem] == -1) {
      iVar1 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(this_00);
      pTVar2 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                         (&this_00->super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar1);
      TPZGeoNode::Initialize(pTVar2,&newnodecoord_X.super_TPZVec<double>,mesh);
      newnodeindexes->fStore[nelem] = (long)iVar1;
    }
    TPZManVector<double,_3>::~TPZManVector(&newnodecoord_X);
    TPZManVector<double,_3>::~TPZManVector(&newnodecoord_xi);
    TPZManVector<double,_3>::~TPZManVector(&neighbourcoord_X);
    TPZManVector<double,_3>::~TPZManVector(&refnodecoord_X);
    lVar8 = lVar8 + 1;
  }
  std::operator<<((ostream *)&std::cout,
                  "Refpattern is trying to create midnode but there is another node which is not in the right position!\n"
                 );
  std::operator<<((ostream *)&std::cout,
                  "Either the refinement patterns are incompatible or there is an issue with the mapping.\n"
                 );
  std::operator<<((ostream *)&std::cout,"newnodecoord_X(");
  poVar4 = std::ostream::_M_insert<double>(*newnodecoord_X.super_TPZVec<double>.fStore);
  std::operator<<(poVar4,",");
  poVar4 = std::ostream::_M_insert<double>(newnodecoord_X.super_TPZVec<double>.fStore[1]);
  std::operator<<(poVar4,",");
  poVar4 = std::ostream::_M_insert<double>(newnodecoord_X.super_TPZVec<double>.fStore[2]);
  poVar4 = std::operator<<(poVar4,")");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::operator<<((ostream *)&std::cout,"neighbourcoord_X(");
  poVar4 = std::ostream::_M_insert<double>(*neighbourcoord_X.super_TPZVec<double>.fStore);
  std::operator<<(poVar4,",");
  poVar4 = std::ostream::_M_insert<double>(neighbourcoord_X.super_TPZVec<double>.fStore[1]);
  std::operator<<(poVar4,",");
  poVar4 = std::ostream::_M_insert<double>(neighbourcoord_X.super_TPZVec<double>.fStore[2]);
  poVar4 = std::operator<<(poVar4,")");
  std::endl<char,std::char_traits<char>>(poVar4);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Refine/TPZRefPattern.cpp"
             ,0x29b);
}

Assistant:

void TPZRefPattern::CreateMidSideNodes(TPZGeoEl * gel, int side, TPZVec<int64_t> &newnodeindexes)
{
	TPZGeoMesh *gmesh = gel->Mesh();
	//SideNodes returns a vector with the indexes of the internal nodes of the side side
	TPZManVector<int> sideNodes;
	SideNodes(side,sideNodes);
	TPZGeoElSide gelside(gel,side);
	TPZGeoElSide neighbour(gelside.Neighbour());
	TPZManVector<int64_t> sideindices(0);
	//checks if a neighbour element has created a midsidenode already
	while(neighbour.Element() && neighbour != gelside){
		if(neighbour.HasSubElement() && neighbour.Element()->NSideSubElements(neighbour.Side()) > 1)
		{
			neighbour.Element()->MidSideNodeIndices(neighbour.Side(),sideindices);
			break;
		}
		neighbour = neighbour.Neighbour();
	}
	for (int j=0;j<sideNodes.NElements();j++){
		int index = sideNodes[j];
		//new node coordinates
		TPZManVector<REAL,3> refnodecoord_X(3,0.);
		TPZManVector<REAL,3> neighbourcoord_X(3,0.);

		for (int k=0;k<3;k++){
            double coord = fRefPatternMesh.NodeVec()[index].Coord(k);
            refnodecoord_X[k] = coord;
        }

		TPZManVector<REAL,3> newnodecoord_xi(Element(0)->Dimension(),0.);

		//getting node coordinates in refpattern mesh: just a matter of adjusting dimension
		for(int iX = 0; iX < Element(0)->Dimension(); iX++) newnodecoord_xi[iX] = refnodecoord_X[iX];

        //coordinates of the node to be created (if it hasnt been created yet)
		TPZManVector<REAL,3> newnodecoord_X(3);
		gel->X(newnodecoord_xi,newnodecoord_X);

		newnodeindexes[index] = -1;
		REAL smallestDiff = -1.;
		int smallestDiffIndex = -1;
		//check if the node has already been created using information previsouly obtained from neighbour
		for(int i=0; i< sideindices.NElements(); i++)
		{
			for(int k=0; k<3; k++) neighbourcoord_X[k] = gmesh->NodeVec()[sideindices[i]].Coord(k);
			REAL dif = 0.;
			for (int k=0;k<3;k++)
			{
				dif += (newnodecoord_X[k] - neighbourcoord_X[k]) * (newnodecoord_X[k] - neighbourcoord_X[k]);
			}
			if(smallestDiffIndex < 0. || smallestDiff > dif)
			{
				smallestDiff = dif;
				smallestDiffIndex = i;
			}
		}
		if (smallestDiff < 1e-2 && sideindices.NElements() != 0)
		{
			newnodeindexes[index] = sideindices[smallestDiffIndex];
		}
		if (smallestDiff >= 1.e-2 && sideindices.NElements() != 0)
		{
#ifdef PZ_LOG
			{
				std::stringstream sout;
				sout << "Incompatible refinement patterns detected\n";
				sout << "Closest node at distance " << smallestDiff << std::endl;
				gel->Print(sout);
				LOGPZ_ERROR(logger,sout.str())
			}
#endif
            std::cout << "Refpattern is trying to create midnode but there is another node which is not in the right position!\n";
            std::cout << "Either the refinement patterns are incompatible or there is an issue with the mapping.\n";
            std::cout << "newnodecoord_X(" << newnodecoord_X[0] << "," << newnodecoord_X[1] << "," << newnodecoord_X[2] << ")" << std::endl;
            std::cout << "neighbourcoord_X(" << neighbourcoord_X[0] << "," << neighbourcoord_X[1] << "," << neighbourcoord_X[2] << ")" << std::endl;
			DebugStop();
		}
		if (newnodeindexes[index] == -1)
		{
			//If no one has created the node yet, it should be created
			int64_t newindex = gmesh->NodeVec().AllocateNewElement();
			gmesh->NodeVec()[newindex].Initialize(newnodecoord_X,*gmesh);
			newnodeindexes[index] = newindex;
		}
	}
}